

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void singlesocket(Curl_multi *multi,SessionHandle *data)

{
  curl_hash *h;
  connectdata *pcVar1;
  curl_llist *pcVar2;
  uint uVar3;
  bool bVar4;
  Curl_multi *pCVar5;
  uint uVar6;
  uint uVar7;
  undefined8 *p;
  void *pvVar8;
  long *plVar9;
  curl_llist_element *curr_1;
  ulong uVar10;
  int in_EDX;
  uint uVar11;
  SessionHandle *pSVar12;
  ulong uVar13;
  long lVar14;
  curl_socket_t s;
  curl_socket_t socks [5];
  int local_58;
  int local_54;
  Curl_multi *local_50;
  curl_socket_t local_48 [6];
  
  local_48[0] = -1;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  uVar6 = multi_getsock(data,local_48,in_EDX);
  uVar13 = 0;
  local_50 = multi;
  do {
    if ((uVar6 >> ((byte)uVar13 & 0x1f) & 0x10001) == 0) goto LAB_00468b46;
    local_58 = local_48[uVar13];
    p = (undefined8 *)Curl_hash_pick(multi->sockhash,&local_58,4);
    uVar11 = uVar6 >> ((byte)uVar13 & 0x1f);
    uVar7 = uVar11 & 1;
    uVar3 = uVar7 + 2;
    if ((uVar11 >> 0x10 & 1) == 0) {
      uVar3 = uVar7;
    }
    if (p == (undefined8 *)0x0) {
      h = multi->sockhash;
      local_54 = local_58;
      p = (undefined8 *)Curl_hash_pick(h,&local_54,4);
      multi = local_50;
      if (p == (undefined8 *)0x0) {
        p = (undefined8 *)(*Curl_ccalloc)(1,0x20);
        if (p == (undefined8 *)0x0) {
          return;
        }
        *p = data;
        *(int *)((long)p + 0x14) = local_54;
        pvVar8 = Curl_hash_add(h,&local_54,4,p);
        multi = local_50;
        if (pvVar8 == (void *)0x0) {
          (*Curl_cfree)(p);
          return;
        }
      }
LAB_00468b11:
      if (multi->socket_cb != (curl_socket_callback)0x0) {
        (*multi->socket_cb)(data,local_58,uVar3,multi->socket_userp,(void *)p[3]);
      }
      *(uint *)(p + 2) = uVar3;
    }
    else if (*(uint *)(p + 2) != uVar3) goto LAB_00468b11;
    uVar13 = uVar13 + 1;
  } while (uVar13 != 5);
  uVar13 = 5;
LAB_00468b46:
  pCVar5 = local_50;
  if (0 < data->numsocks) {
    lVar14 = 0;
    do {
      local_58 = data->sockets[lVar14];
      if ((int)uVar13 != 0) {
        uVar10 = 0;
        do {
          if (local_58 == local_48[uVar10]) {
            local_58 = -1;
            goto LAB_00468c41;
          }
          uVar10 = uVar10 + 1;
        } while ((uVar13 & 0xffffffff) != uVar10);
      }
      if ((local_58 != -1) &&
         (plVar9 = (long *)Curl_hash_pick(local_50->sockhash,&local_58,4), plVar9 != (long *)0x0)) {
        pcVar1 = data->easy_conn;
        if (pcVar1 == (connectdata *)0x0) {
LAB_00468c16:
          if (pCVar5->socket_cb != (curl_socket_callback)0x0) {
            (*pCVar5->socket_cb)(data,local_58,4,pCVar5->socket_userp,(void *)plVar9[3]);
          }
          sh_delentry(pCVar5->sockhash,local_58);
        }
        else {
          pcVar2 = pcVar1->recv_pipe;
          bVar4 = true;
          if ((pcVar2 != (curl_llist *)0x0) && (1 < pcVar2->size)) {
            if ((SessionHandle *)*plVar9 == data) {
              pSVar12 = (SessionHandle *)pcVar2->head->ptr;
              if (pSVar12 == data) {
                pSVar12 = (SessionHandle *)pcVar2->head->next->ptr;
              }
              *plVar9 = (long)pSVar12;
            }
            bVar4 = false;
          }
          pcVar2 = pcVar1->send_pipe;
          if ((pcVar2 == (curl_llist *)0x0) || (pcVar2->size < 2)) {
            if (bVar4) goto LAB_00468c16;
          }
          else if ((SessionHandle *)*plVar9 == data) {
            pSVar12 = (SessionHandle *)pcVar2->head->ptr;
            if (pSVar12 == data) {
              *plVar9 = (long)pcVar2->head->next->ptr;
            }
            else {
              *plVar9 = (long)pSVar12;
            }
          }
        }
      }
LAB_00468c41:
      lVar14 = lVar14 + 1;
    } while (lVar14 < data->numsocks);
  }
  memcpy(data->sockets,local_48,(uVar13 & 0xffffffff) << 2);
  data->numsocks = (int)uVar13;
  return;
}

Assistant:

static void singlesocket(struct Curl_multi *multi,
                         struct SessionHandle *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  bool remove_sock_from_hash;

  for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i=0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    int action = CURL_POLL_NONE;

    s = socks[i];

    /* get it from the hash */
    entry = Curl_hash_pick(multi->sockhash, (char *)&s, sizeof(s));

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    if(entry) {
      /* yeps, already present so check if it has the same action set */
      if(entry->action == action)
        /* same, continue */
        continue;
    }
    else {
      /* this is a socket we didn't have before, add it! */
      entry = sh_addentry(multi->sockhash, s, data);
      if(!entry)
        /* fatal */
        return;
    }

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       action,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = action; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i=0; i< data->numsocks; i++) {
    int j;
    s = data->sockets[i];
    for(j=0; j<num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        s = CURL_SOCKET_BAD;
        break;
      }
    }
    if(s != CURL_SOCKET_BAD) {

      /* this socket has been removed. Tell the app to remove it */
      remove_sock_from_hash = TRUE;

      entry = Curl_hash_pick(multi->sockhash, (char *)&s, sizeof(s));
      if(entry) {
        /* check if the socket to be removed serves a connection which has
           other easy-s in a pipeline. In this case the socket should not be
           removed. */
        struct connectdata *easy_conn = data->easy_conn;
        if(easy_conn) {
          if(easy_conn->recv_pipe && easy_conn->recv_pipe->size > 1) {
            /* the handle should not be removed from the pipe yet */
            remove_sock_from_hash = FALSE;

            /* Update the sockhash entry to instead point to the next in line
               for the recv_pipe, or the first (in case this particular easy
               isn't already) */
            if(entry->easy == data) {
              if(isHandleAtHead(data, easy_conn->recv_pipe))
                entry->easy = easy_conn->recv_pipe->head->next->ptr;
              else
                entry->easy = easy_conn->recv_pipe->head->ptr;
            }
          }
          if(easy_conn->send_pipe  && easy_conn->send_pipe->size > 1) {
            /* the handle should not be removed from the pipe yet */
            remove_sock_from_hash = FALSE;

            /* Update the sockhash entry to instead point to the next in line
               for the send_pipe, or the first (in case this particular easy
               isn't already) */
            if(entry->easy == data) {
              if(isHandleAtHead(data, easy_conn->send_pipe))
                entry->easy = easy_conn->send_pipe->head->next->ptr;
              else
                entry->easy = easy_conn->send_pipe->head->ptr;
            }
          }
          /* Don't worry about overwriting recv_pipe head with send_pipe_head,
             when action will be asked on the socket (see multi_socket()), the
             head of the correct pipe will be taken according to the
             action. */
        }
      }
      else
        /* just a precaution, this socket really SHOULD be in the hash already
           but in case it isn't, we don't have to tell the app to remove it
           either since it never got to know about it */
        remove_sock_from_hash = FALSE;

      if(remove_sock_from_hash) {
        /* in this case 'entry' is always non-NULL */
        if(multi->socket_cb)
          multi->socket_cb(data,
                           s,
                           CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(multi->sockhash, s);
      }

    }
  }

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  data->numsocks = num;
}